

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

double __thiscall pstore::basic_logger::log(basic_logger *this,double __x)

{
  time_t t;
  pointer pvVar1;
  ostream *poVar2;
  czstring pcVar3;
  undefined8 in_RDX;
  priority in_ESI;
  double dVar4;
  string local_208 [32];
  lock_guard<std::mutex> local_1e8;
  lock_guard<std::mutex> lock;
  ostringstream local_1d0 [8];
  ostringstream str;
  czstring time_str;
  size_t local_48;
  size_t r;
  array<char,_25UL> time_buffer;
  string *message_local;
  priority p_local;
  basic_logger *this_local;
  
  time_buffer._M_elems._17_8_ = in_RDX;
  t = time((time_t *)0x0);
  time_str = (czstring)gsl::make_span<char,25ul>((array<char,_25UL> *)((long)&r + 7));
  local_48 = time_string(t,(span<char,_25L> *)&time_str);
  if (local_48 == 0x18) {
    pvVar1 = std::array<char,_25UL>::data((array<char,_25UL> *)((long)&r + 7));
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    poVar2 = std::operator<<((ostream *)local_1d0,pvVar1);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = std::operator<<(poVar2,(string *)&this->thread_name_);
    poVar2 = std::operator<<(poVar2," - ");
    pcVar3 = priority_string(in_ESI);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = std::operator<<(poVar2,(string *)time_buffer._M_elems._17_8_);
    std::operator<<(poVar2,'\n');
    std::lock_guard<std::mutex>::lock_guard(&local_1e8,(mutex_type *)mutex_);
    std::__cxx11::ostringstream::str();
    (*(this->super_logger)._vptr_logger[0xc])(this,local_208);
    std::__cxx11::string::~string(local_208);
    std::lock_guard<std::mutex>::~lock_guard(&local_1e8);
    dVar4 = (double)std::__cxx11::ostringstream::~ostringstream(local_1d0);
    return dVar4;
  }
  assert_failed("r == sizeof (time_buffer) - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/logging.cpp"
                ,0x162);
}

Assistant:

void basic_logger::log (priority const p, std::string const & message) {
            std::array<char, time_buffer_size> time_buffer;
            std::size_t const r = time_string (std::time (nullptr), ::gsl::make_span (time_buffer));
            (void) r;
            PSTORE_ASSERT (r == sizeof (time_buffer) - 1);
            gsl::czstring const time_str = time_buffer.data ();
            std::ostringstream str;
            str << time_str << " - " << thread_name_ << " - " << priority_string (p) << " - "
                << message << '\n';

            std::lock_guard<std::mutex> const lock (mutex_);
            this->log_impl (str.str ());
        }